

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O2

TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_> * __thiscall
TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstruct<long_double>_>::PopItem
          (TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_>
           *__return_storage_ptr__,
          TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstruct<long_double>_> *this)

{
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_>::TPZDohrPrecondV2SubData
            (__return_storage_ptr__);
  std::mutex::lock(&this->fAccessLock);
  if ((this->fWork).
      super__List_base<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_>::operator=
              (__return_storage_ptr__,
               (TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_> *)
               ((this->fWork).
                super__List_base<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::
    list<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstruct<long_double>_>_>_>
    ::pop_front(&this->fWork);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

TPZDohrPrecondV2SubData<TVar, TSubStruct> PopItem()
	{
		TPZDohrPrecondV2SubData<TVar, TSubStruct> result;
        std::lock_guard<std::mutex> lock(fAccessLock);
		if (fWork.size()) {
			result = *fWork.begin();
			fWork.pop_front();
		}
		return result;
	}